

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O3

wchar_t close_and_restore_time(wchar_t fd,tree *t,restore_time *rt)

{
  wchar_t in_EAX;
  wchar_t wVar1;
  int iVar2;
  timeval times [2];
  timeval local_68;
  time_t local_58;
  long local_50;
  timespec local_48;
  time_t local_38;
  long lStack_30;
  
  if (((t->flags & 0x80) == 0) || (rt->noatime != 0)) {
    if (L'\xffffffff' < fd) {
      wVar1 = close(fd);
      return wVar1;
    }
  }
  else {
    local_38 = rt->mtime;
    lStack_30 = rt->mtime_nsec;
    local_48.tv_sec = rt->atime;
    local_48.tv_nsec = rt->atime_nsec;
    iVar2 = futimens(fd,&local_48);
    if (iVar2 == 0) {
      in_EAX = close(fd);
    }
    else {
      local_58 = rt->mtime;
      local_50 = rt->mtime_nsec / 1000;
      local_68.tv_sec = rt->atime;
      local_68.tv_usec = rt->atime_nsec / 1000;
      close(fd);
      in_EAX = futimesat(t->working_dir_fd,rt->name,&local_68);
      if (in_EAX != L'\0') {
        in_EAX = lutimes(rt->name,&local_68);
      }
    }
  }
  return in_EAX;
}

Assistant:

static int
close_and_restore_time(int fd, struct tree *t, struct restore_time *rt)
{
#ifndef HAVE_UTIMES
	(void)t; /* UNUSED */
	(void)rt; /* UNUSED */
	return (close(fd));
#else
#if defined(HAVE_FUTIMENS) && !defined(__CYGWIN__)
	struct timespec timespecs[2];
#endif
	struct timeval times[2];

	if ((t->flags & needsRestoreTimes) == 0 || rt->noatime) {
		if (fd >= 0)
			return (close(fd));
		else
			return (0);
	}

#if defined(HAVE_FUTIMENS) && !defined(__CYGWIN__)
	timespecs[1].tv_sec = rt->mtime;
	timespecs[1].tv_nsec = rt->mtime_nsec;

	timespecs[0].tv_sec = rt->atime;
	timespecs[0].tv_nsec = rt->atime_nsec;
	/* futimens() is defined in POSIX.1-2008. */
	if (futimens(fd, timespecs) == 0)
		return (close(fd));
#endif

	times[1].tv_sec = rt->mtime;
	times[1].tv_usec = rt->mtime_nsec / 1000;

	times[0].tv_sec = rt->atime;
	times[0].tv_usec = rt->atime_nsec / 1000;

#if !defined(HAVE_FUTIMENS) && defined(HAVE_FUTIMES) && !defined(__CYGWIN__)
	if (futimes(fd, times) == 0)
		return (close(fd));
#endif
	close(fd);
#if defined(HAVE_FUTIMESAT)
	if (futimesat(tree_current_dir_fd(t), rt->name, times) == 0)
		return (0);
#endif
#ifdef HAVE_LUTIMES
	if (lutimes(rt->name, times) != 0)
#else
	if (AE_IFLNK != rt->filetype && utimes(rt->name, times) != 0)
#endif
		return (-1);
#endif
	return (0);
}